

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QModelIndex * __thiscall
QTreeView::moveCursor
          (QModelIndex *__return_storage_ptr__,QTreeView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  QTreeViewPrivate *this_00;
  QHeaderView *this_01;
  QTreeViewItem *pQVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  QScrollBar *this_02;
  QStyle *pQVar8;
  QWidget *this_03;
  uint i;
  int iVar9;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
  if ((((int)local_58 < 0) || ((long)local_58 < 0)) || (local_48.ptr == (QAbstractItemModel *)0x0))
  {
    iVar5 = QTreeViewPrivate::below(this_00,-1);
    for (iVar9 = 0; iVar6 = QHeaderView::count(this_00->header), iVar9 < iVar6; iVar9 = iVar9 + 1) {
      this_01 = this_00->header;
      iVar6 = QHeaderView::logicalIndex(this_01,iVar9);
      bVar3 = QHeaderView::isSectionHidden(this_01,iVar6);
      if (!bVar3) break;
    }
    if (((this_00->viewItems).d.size <= (long)iVar5) ||
       (iVar6 = QHeaderView::count(this_00->header), iVar6 <= iVar9)) {
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      goto LAB_00545646;
    }
    iVar9 = QHeaderView::logicalIndex(this_00->header,iVar9);
    goto LAB_00545641;
  }
  uVar4 = QTreeViewPrivate::viewIndex(this_00,(QModelIndex *)&local_58);
  i = 0;
  if (0 < (int)uVar4) {
    i = uVar4;
  }
  bVar3 = QWidget::isRightToLeft((QWidget *)this);
  if (!bVar3) {
    switch(cursorAction) {
    case MoveUp:
    case MovePrevious:
      goto switchD_00545474_caseD_0;
    case MoveDown:
    case MoveNext:
      goto switchD_00545474_caseD_1;
    case MoveLeft:
      goto switchD_00545474_caseD_3;
    case MoveRight:
      goto switchD_00545474_caseD_2;
    case MoveHome:
      goto switchD_00545474_caseD_4;
    case MoveEnd:
      goto switchD_00545474_caseD_5;
    case MovePageUp:
      goto switchD_00545474_caseD_6;
    case MovePageDown:
      goto switchD_00545474_caseD_7;
    default:
      goto switchD_00545474_default;
    }
  }
  switch(cursorAction) {
  case MoveUp:
  case MovePrevious:
    goto switchD_00545474_caseD_0;
  case MoveDown:
  case MoveNext:
switchD_00545474_caseD_1:
    iVar5 = QTreeViewPrivate::below(this_00,i);
    break;
  case MoveLeft:
switchD_00545474_caseD_2:
    uVar7 = (ulong)i;
    if ((ulong)(this_00->viewItems).d.size <= uVar7) {
LAB_0054566c:
      pQVar8 = QWidget::style((QWidget *)this);
      iVar5 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x4f,0,this,0);
      if (iVar5 != 0) {
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
        __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        iVar5 = QTreeViewPrivate::below(this_00,i);
        QTreeViewPrivate::modelIndex(__return_storage_ptr__,this_00,iVar5,0);
        QModelIndex::parent(&local_70,__return_storage_ptr__);
        if (((local_70.r == (int)local_58) && (local_70.c == local_58._4_4_)) &&
           (((undefined1 *)local_70.i == puStack_50 && (local_70.m.ptr == local_48.ptr))))
        goto LAB_00545646;
      }
      if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior & ~SelectColumns) ==
          SelectItems) {
        iVar5 = QHeaderView::visualIndex(this_00->header,local_58._4_4_);
        do {
          iVar5 = iVar5 + 1;
          pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
          QModelIndex::parent(&local_70,(QModelIndex *)&local_58);
          iVar9 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_70);
          if (iVar9 <= iVar5) break;
          iVar9 = QHeaderView::logicalIndex(this_00->header,iVar5);
          bVar3 = isColumnHidden(this,iVar9);
        } while (bVar3);
        iVar5 = QHeaderView::logicalIndex(this_00->header,iVar5);
        *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
        __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::sibling(__return_storage_ptr__,(QModelIndex *)&local_58,(int)local_58,iVar5);
        bVar3 = QModelIndex::isValid(__return_storage_ptr__);
        if (bVar3) goto LAB_00545646;
      }
      this_02 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar5 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
      iVar9 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
      iVar6 = QAbstractSlider::singleStep(&this_02->super_QAbstractSlider);
      iVar9 = iVar9 + iVar6;
      goto LAB_00545917;
    }
    pQVar1 = (this_00->viewItems).d.ptr;
    if ((((pQVar1[uVar7].field_0x1c & 1) != 0) || (this_00->itemsExpandable != true)) ||
       (bVar3 = QTreeViewPrivate::hasVisibleChildren(this_00,&pQVar1[uVar7].index), !bVar3))
    goto LAB_0054566c;
    QTreeViewPrivate::expand(this_00,i,true);
LAB_0054592e:
    (this_00->super_QAbstractItemViewPrivate).moveCursorUpdatedView = true;
    goto LAB_00545936;
  case MoveRight:
switchD_00545474_caseD_3:
    this_02 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    if ((((ulong)i < (ulong)(this_00->viewItems).d.size) &&
        (((this_00->viewItems).d.ptr[i].field_0x1c & 1) != 0)) && (this_00->itemsExpandable == true)
       ) {
      iVar5 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
      iVar9 = QAbstractSlider::minimum(&this_02->super_QAbstractSlider);
      if (iVar5 == iVar9) {
        QTreeViewPrivate::collapse(this_00,i,true);
        goto LAB_0054592e;
      }
    }
    pQVar8 = QWidget::style((QWidget *)this);
    iVar5 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x4f,0,this,0);
    if (iVar5 != 0) {
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent(__return_storage_ptr__,(QModelIndex *)&local_58);
      bVar3 = QModelIndex::isValid(__return_storage_ptr__);
      if (bVar3) {
        QAbstractItemView::rootIndex(&local_70,(QAbstractItemView *)this);
        bVar3 = ::operator!=(__return_storage_ptr__,&local_70);
        if (bVar3) goto LAB_00545646;
      }
    }
    if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior & ~SelectColumns) ==
        SelectItems) {
      iVar5 = QHeaderView::visualIndex(this_00->header,local_58._4_4_);
      do {
        iVar9 = iVar5 + -1;
        if (iVar5 < 1) break;
        iVar5 = QHeaderView::logicalIndex(this_00->header,iVar9);
        bVar3 = isColumnHidden(this,iVar5);
        iVar5 = iVar9;
      } while (bVar3);
      iVar5 = QHeaderView::logicalIndex(this_00->header,iVar9);
      *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::sibling(__return_storage_ptr__,(QModelIndex *)&local_58,(int)local_58,iVar5);
      bVar3 = QModelIndex::isValid(__return_storage_ptr__);
      if (bVar3) goto LAB_00545646;
    }
    iVar5 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    iVar9 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    iVar6 = QAbstractSlider::singleStep(&this_02->super_QAbstractSlider);
    iVar9 = iVar9 - iVar6;
LAB_00545917:
    QAbstractSlider::setValue(&this_02->super_QAbstractSlider,iVar9);
    iVar9 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    if (iVar5 != iVar9) goto LAB_0054592e;
LAB_00545936:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x268))(this);
    this_03 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QWidget::update(this_03);
switchD_00545474_default:
    (__return_storage_ptr__->m).ptr = local_48.ptr;
    *(undefined1 **)__return_storage_ptr__ = local_58;
    __return_storage_ptr__->i = (quintptr)puStack_50;
    goto LAB_00545646;
  case MoveHome:
switchD_00545474_caseD_4:
    iVar5 = QTreeViewPrivate::itemForKeyHome(this_00);
    break;
  case MoveEnd:
switchD_00545474_caseD_5:
    iVar5 = QTreeViewPrivate::itemForKeyEnd(this_00);
    break;
  case MovePageUp:
switchD_00545474_caseD_6:
    iVar5 = QTreeViewPrivate::pageUp(this_00,i);
    break;
  case MovePageDown:
switchD_00545474_caseD_7:
    iVar5 = QTreeViewPrivate::pageDown(this_00,i);
    break;
  default:
    goto switchD_00545474_default;
  }
LAB_00545635:
  iVar9 = local_58._4_4_;
LAB_00545641:
  QTreeViewPrivate::modelIndex(__return_storage_ptr__,this_00,iVar5,iVar9);
LAB_00545646:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
switchD_00545474_caseD_0:
  iVar5 = QTreeViewPrivate::above(this_00,i);
  goto LAB_00545635;
}

Assistant:

QModelIndex QTreeView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QTreeView);
    Q_UNUSED(modifiers);

    d->executePostedLayout();

    QModelIndex current = currentIndex();
    if (!current.isValid()) {
        int i = d->below(-1);
        int c = 0;
        while (c < d->header->count() && d->header->isSectionHidden(d->header->logicalIndex(c)))
            ++c;
        if (i < d->viewItems.size() && c < d->header->count()) {
            return d->modelIndex(i, d->header->logicalIndex(c));
        }
        return QModelIndex();
    }

    const int vi = qMax(0, d->viewIndex(current));

    if (isRightToLeft()) {
        if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
        else if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
    }
    switch (cursorAction) {
    case MoveNext:
    case MoveDown:
#ifdef QT_KEYPAD_NAVIGATION
        if (vi == d->viewItems.count()-1 && QApplicationPrivate::keypadNavigationEnabled())
            return d->model->index(0, current.column(), d->root);
#endif
        return d->modelIndex(d->below(vi), current.column());
    case MovePrevious:
    case MoveUp:
#ifdef QT_KEYPAD_NAVIGATION
        if (vi == 0 && QApplicationPrivate::keypadNavigationEnabled())
            return d->modelIndex(d->viewItems.count() - 1, current.column());
#endif
        return d->modelIndex(d->above(vi), current.column());
    case MoveLeft: {
        QScrollBar *sb = horizontalScrollBar();
        if (vi < d->viewItems.size() && d->viewItems.at(vi).expanded && d->itemsExpandable && sb->value() == sb->minimum()) {
            d->collapse(vi, true);
            d->moveCursorUpdatedView = true;
        } else {
            bool descend = style()->styleHint(QStyle::SH_ItemView_ArrowKeysNavigateIntoChildren, nullptr, this);
            if (descend) {
                QModelIndex par = current.parent();
                if (par.isValid() && par != rootIndex())
                    return par;
                else
                    descend = false;
            }
            if (!descend) {
                if (d->selectionBehavior == SelectItems || d->selectionBehavior == SelectColumns) {
                    int visualColumn = d->header->visualIndex(current.column()) - 1;
                    while (visualColumn >= 0 && isColumnHidden(d->header->logicalIndex(visualColumn)))
                        visualColumn--;
                    int newColumn = d->header->logicalIndex(visualColumn);
                    QModelIndex next = current.sibling(current.row(), newColumn);
                    if (next.isValid())
                        return next;
                }

                int oldValue = sb->value();
                sb->setValue(sb->value() - sb->singleStep());
                if (oldValue != sb->value())
                    d->moveCursorUpdatedView = true;
            }

        }
        updateGeometries();
        viewport()->update();
        break;
    }
    case MoveRight:
        if (vi < d->viewItems.size() && !d->viewItems.at(vi).expanded && d->itemsExpandable
            && d->hasVisibleChildren(d->viewItems.at(vi).index)) {
            d->expand(vi, true);
            d->moveCursorUpdatedView = true;
        } else {
            bool descend = style()->styleHint(QStyle::SH_ItemView_ArrowKeysNavigateIntoChildren, nullptr, this);
            if (descend) {
                QModelIndex idx = d->modelIndex(d->below(vi));
                if (idx.parent() == current)
                    return idx;
                else
                    descend = false;
            }
            if (!descend) {
                if (d->selectionBehavior == SelectItems || d->selectionBehavior == SelectColumns) {
                    int visualColumn = d->header->visualIndex(current.column()) + 1;
                    while (visualColumn < d->model->columnCount(current.parent()) && isColumnHidden(d->header->logicalIndex(visualColumn)))
                        visualColumn++;
                    const int newColumn = d->header->logicalIndex(visualColumn);
                    const QModelIndex next = current.sibling(current.row(), newColumn);
                    if (next.isValid())
                        return next;
                }

                //last restort: we change the scrollbar value
                QScrollBar *sb = horizontalScrollBar();
                int oldValue = sb->value();
                sb->setValue(sb->value() + sb->singleStep());
                if (oldValue != sb->value())
                    d->moveCursorUpdatedView = true;
            }
        }
        updateGeometries();
        viewport()->update();
        break;
    case MovePageUp:
        return d->modelIndex(d->pageUp(vi), current.column());
    case MovePageDown:
        return d->modelIndex(d->pageDown(vi), current.column());
    case MoveHome:
        return d->modelIndex(d->itemForKeyHome(), current.column());
    case MoveEnd:
        return d->modelIndex(d->itemForKeyEnd(), current.column());
    }
    return current;
}